

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O0

CreatePegoutAddressResponseStruct *
cfd::js::api::ElementsAddressStructApi::CreatePegoutAddress
          (CreatePegoutAddressResponseStruct *__return_storage_ptr__,
          CreatePegoutAddressRequestStruct *request)

{
  CreatePegoutAddressRequestStruct *this;
  string *in_R8;
  allocator local_149;
  function<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&)>
  local_148;
  undefined1 local_128 [270];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreatePegoutAddressRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreatePegoutAddressRequestStruct *request_local;
  CreatePegoutAddressResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  CreatePegoutAddressResponseStruct::CreatePegoutAddressResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::CreatePegoutAddressResponseStruct(cfd::js::api::CreatePegoutAddressRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsAddressStructApi::CreatePegoutAddress(cfd::js::api::CreatePegoutAddressRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::CreatePegoutAddressResponseStruct(cfd::js::api::CreatePegoutAddressRequestStruct_const&)>
              *)local_128,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"CreatePegoutAddress",&local_149);
  ExecuteStructApi<cfd::js::api::CreatePegoutAddressRequestStruct,cfd::js::api::CreatePegoutAddressResponseStruct>
            ((CreatePegoutAddressResponseStruct *)(local_128 + 0x20),(api *)this,
             (CreatePegoutAddressRequestStruct *)local_128,&local_148,in_R8);
  CreatePegoutAddressResponseStruct::operator=
            (__return_storage_ptr__,(CreatePegoutAddressResponseStruct *)(local_128 + 0x20));
  CreatePegoutAddressResponseStruct::~CreatePegoutAddressResponseStruct
            ((CreatePegoutAddressResponseStruct *)(local_128 + 0x20));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::
  function<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&)>
  ::~function((function<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&)>
               *)local_128);
  return __return_storage_ptr__;
}

Assistant:

CreatePegoutAddressResponseStruct
ElementsAddressStructApi::CreatePegoutAddress(
    const CreatePegoutAddressRequestStruct& request) {
  auto call_func = [](const CreatePegoutAddressRequestStruct& request)
      -> CreatePegoutAddressResponseStruct {  // NOLINT
    CreatePegoutAddressResponseStruct response;
    NetType mainchain_net_type =
        AddressStructApi::ConvertNetType(request.network);
    NetType elements_net_type =
        ConvertElementsNetType(request.elements_network);
    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.hash_type);
    Descriptor desc;
    auto addr = ElementsAddressFactory::CreatePegOutAddress(
        mainchain_net_type, elements_net_type, request.descriptor,
        request.bip32_counter, addr_type, &desc);
    response.mainchain_address = addr.GetAddress();
    response.base_descriptor = desc.ToString(false);
    return response;
  };

  CreatePegoutAddressResponseStruct result;
  result = ExecuteStructApi<
      CreatePegoutAddressRequestStruct, CreatePegoutAddressResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}